

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::DebuggerScope::Dump(DebuggerScope *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  anon_class_4_1_5a8de1ea map;
  PCWSTR pWVar4;
  DebuggerScope **ppDVar5;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  int indent;
  DebuggerScope *this_local;
  
  iVar3 = GetScopeDepth(this);
  map.indent = (iVar3 + -1) * 4;
  pWVar4 = GetDebuggerScopeTypeString(this,this->scopeType);
  uVar1 = this->scopeLocation;
  ppDVar5 = Memory::PointerValue<Js::DebuggerScope>(&this->siblingScope);
  Output::Print(map.indent,
                L"Begin scope: Address: %p Type: %s Location: %d Sibling: %p Range: [%d, %d]\n ",
                this,pWVar4,(ulong)uVar1,*ppDVar5,(this->range).begin,(this->range).end);
  bVar2 = HasProperties(this);
  if (bVar2) {
    this_00 = Memory::
              WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
              ::operator->(&this->scopeProperties);
    JsUtil::
    List<Js::DebuggerScopeProperty,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>::
    Map<Js::DebuggerScope::Dump()::__0>
              ((List<Js::DebuggerScopeProperty,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                *)this_00,map);
  }
  Output::Print(L"\n");
  return;
}

Assistant:

void DebuggerScope::Dump()
    {
        int indent = (GetScopeDepth() - 1) * 4;

        Output::Print(indent, _u("Begin scope: Address: %p Type: %s Location: %d Sibling: %p Range: [%d, %d]\n "), this, GetDebuggerScopeTypeString(scopeType), scopeLocation, PointerValue(this->siblingScope), range.begin, range.end);
        if (this->HasProperties())
        {
            this->scopeProperties->Map( [=] (int i, Js::DebuggerScopeProperty& scopeProperty) {
                Output::Print(indent, _u("%s(%d) Location: %d Const: %s Initialized: %d\n"), ThreadContext::GetContextForCurrentThread()->GetPropertyName(scopeProperty.propId)->GetBuffer(),
                    scopeProperty.propId, scopeProperty.location, scopeProperty.IsConst() ? _u("true"): _u("false"), scopeProperty.byteCodeInitializationOffset);
            });
        }

        Output::Print(_u("\n"));
    }